

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnDataCheckpointer::WritePersistentSegments
          (ColumnDataCheckpointer *this,ColumnCheckpointState *state)

{
  ColumnData *pCVar1;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var2;
  reference pvVar3;
  pointer this_00;
  size_type __n;
  DataPointer pointer;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_e0;
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  local_d8;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> *local_c0;
  undefined1 local_b8 [40];
  BaseStatistics local_90;
  _Head_base<0UL,_duckdb::ColumnSegmentState_*,_false> local_38;
  
  pCVar1 = state->column_data;
  local_b8._0_8_ = &(pCVar1->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock;
  local_b8[8] = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b8);
  local_b8[8] = true;
  local_d8.
  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pCVar1->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
       super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
       .
       super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d8.
  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pCVar1->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
       super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
       .
       super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d8.
  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pCVar1->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
       super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
       .
       super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pCVar1->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
  super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar1->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
  super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar1->data).super_SegmentTree<duckdb::ColumnSegment,_false>.nodes.
  super_vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  .
  super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b8);
  if (local_d8.
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_c0 = &state->global_stats;
    __n = 0;
    do {
      pvVar3 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[]
                         ((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *)&local_d8,__n)
      ;
      _Var2._M_head_impl =
           (pvVar3->node).
           super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
           .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
      ColumnSegment::GetDataPointer((DataPointer *)local_b8,_Var2._M_head_impl);
      this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator->(local_c0);
      BaseStatistics::Merge(this_00,&((_Var2._M_head_impl)->stats).statistics);
      pvVar3 = vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true>::operator[]
                         ((vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_true> *)&local_d8,__n)
      ;
      local_e0._M_head_impl =
           (pvVar3->node).
           super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
           .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
      (pvVar3->node).
      super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
      super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
      super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
      SegmentTree<duckdb::ColumnSegment,_false>::AppendSegment
                (&(state->new_tree).super_SegmentTree<duckdb::ColumnSegment,_false>,
                 (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                  *)&local_e0);
      _Var2._M_head_impl = local_e0._M_head_impl;
      if (local_e0._M_head_impl != (ColumnSegment *)0x0) {
        ColumnSegment::~ColumnSegment(local_e0._M_head_impl);
        operator_delete(_Var2._M_head_impl);
      }
      local_e0._M_head_impl = (ColumnSegment *)0x0;
      ::std::vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>::
      emplace_back<duckdb::DataPointer>
                (&(state->data_pointers).
                  super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>,
                 (DataPointer *)local_b8);
      if (local_38._M_head_impl != (ColumnSegmentState *)0x0) {
        (*(local_38._M_head_impl)->_vptr_ColumnSegmentState[1])();
      }
      local_38._M_head_impl = (ColumnSegmentState *)0x0;
      BaseStatistics::~BaseStatistics(&local_90);
      __n = __n + 1;
    } while (__n < (ulong)((long)local_d8.
                                 super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.
                                 super__Vector_base<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  ::std::
  vector<duckdb::SegmentNode<duckdb::ColumnSegment>,_std::allocator<duckdb::SegmentNode<duckdb::ColumnSegment>_>_>
  ::~vector(&local_d8);
  return;
}

Assistant:

void ColumnDataCheckpointer::WritePersistentSegments(ColumnCheckpointState &state) {
	// all segments are persistent and there are no updates
	// we only need to write the metadata

	auto &col_data = state.column_data;
	auto nodes = col_data.data.MoveSegments();

	for (idx_t segment_idx = 0; segment_idx < nodes.size(); segment_idx++) {
		auto segment = nodes[segment_idx].node.get();
		auto pointer = segment->GetDataPointer();

		// merge the persistent stats into the global column stats
		state.global_stats->Merge(segment->stats.statistics);

		// directly append the current segment to the new tree
		state.new_tree.AppendSegment(std::move(nodes[segment_idx].node));

		state.data_pointers.push_back(std::move(pointer));
	}
}